

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<Fad<double>,_20>::TPZManVector
          (TPZManVector<Fad<double>,_20> *this,int64_t size,Fad<double> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong uVar4;
  int64_t i;
  Fad<double> *in_stack_ffffffffffffff38;
  Fad<double> *in_stack_ffffffffffffff40;
  Fad<double> *in_stack_ffffffffffffff50;
  ulong *local_90;
  int64_t in_stack_ffffffffffffff98;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffffa0;
  undefined8 *local_38;
  long local_30;
  
  TPZVec<Fad<double>_>::TPZVec(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDI = &PTR__TPZManVector_0245c0d0;
  local_38 = in_RDI + 4;
  do {
    Fad<double>::Fad(in_stack_ffffffffffffff50);
    local_38 = local_38 + 4;
  } while (local_38 != in_RDI + 0x54);
  if ((long)in_RSI < 0x15) {
    in_RDI[1] = in_RDI + 4;
    in_RDI[2] = in_RSI;
    in_RDI[3] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar4 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar4 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar3 = (ulong *)operator_new__(uVar4);
    *puVar3 = in_RSI;
    puVar3 = puVar3 + 1;
    if (in_RSI != 0) {
      local_90 = puVar3;
      do {
        Fad<double>::Fad(in_stack_ffffffffffffff50);
        local_90 = local_90 + 4;
      } while (local_90 != puVar3 + in_RSI * 4);
    }
    in_RDI[1] = puVar3;
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  for (local_30 = 0; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
    Fad<double>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}